

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O3

void __thiscall inja::Renderer::throw_renderer_error(Renderer *this,string *message,AstNode *node)

{
  long lVar1;
  pointer pcVar2;
  long lVar3;
  void *pvVar4;
  RenderError *this_00;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  SourceLocation location;
  
  uVar6 = (this->current_template->content)._M_string_length;
  if (node->pos < uVar6) {
    uVar6 = node->pos;
  }
  if (uVar6 == 0) {
LAB_00155c6c:
    sVar7 = uVar6 + 1;
    sVar8 = 1;
  }
  else {
    pcVar2 = (this->current_template->content)._M_dataplus._M_p;
    lVar9 = 0;
    do {
      if (-lVar9 == uVar6) goto LAB_00155c6c;
      lVar1 = lVar9 + -1;
      lVar3 = lVar9 + (uVar6 - 1);
      lVar9 = lVar1;
    } while (pcVar2[lVar3] != '\n');
    uVar5 = 0;
    lVar9 = 0;
    do {
      pvVar4 = memchr(pcVar2 + uVar5,10,uVar6 - uVar5);
      uVar5 = (long)pvVar4 + (1 - (long)pcVar2);
      if ((pvVar4 == (void *)0x0) || (uVar5 == 0)) break;
      lVar9 = lVar9 + 1;
    } while (uVar5 < uVar6);
    sVar8 = lVar9 + 1;
    sVar7 = -lVar1;
  }
  this_00 = (RenderError *)__cxa_allocate_exception(0x60);
  location.column = sVar7;
  location.line = sVar8;
  RenderError::RenderError(this_00,message,location);
  __cxa_throw(this_00,&RenderError::typeinfo,InjaError::~InjaError);
}

Assistant:

void throw_renderer_error(const std::string& message, const AstNode& node) {
    const SourceLocation loc = get_source_location(current_template->content, node.pos);
    INJA_THROW(RenderError(message, loc));
  }